

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::operator()(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             *this,basic_string_view<wchar_t> value)

{
  char cVar1;
  uint uVar2;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar3;
  ulong uVar4;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it;
  wchar_t *data;
  str_writer<wchar_t> local_28;
  
  uVar4 = value.size_;
  local_28.s = value.data_;
  if (this->specs_ == (format_specs *)0x0) {
    bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                      (local_28.s,local_28.s + uVar4,(this->writer_).out_.container);
    (this->writer_).out_.container = bVar3.container;
  }
  else {
    cVar1 = (this->specs_->super_core_format_specs).type;
    if ((cVar1 != '\0') && (cVar1 != 's')) {
      error_handler::on_error((error_handler *)&local_28,"invalid type specifier");
    }
    uVar2 = (this->specs_->super_core_format_specs).precision;
    local_28.size_ = (ulong)uVar2;
    if (uVar4 <= uVar2) {
      local_28.size_ = uVar4;
    }
    if ((int)uVar2 < 0) {
      local_28.size_ = uVar4;
    }
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
    ::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::str_writer<wchar_t>>
              ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
                *)this,&this->specs_->super_align_spec,&local_28);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }